

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operations.c
# Opt level: O3

int gb_xor(uint8_t value,Cpu *cpu)

{
  uint8_t *flags;
  byte bVar1;
  
  flags = cpu->registers + 5;
  bVar1 = cpu->registers[0];
  cpu->registers[0] = bVar1 ^ value;
  if (bVar1 == value) {
    set_flag(flags,Flag_Zero);
  }
  else {
    clear_flag(flags,Flag_Zero);
  }
  clear_flag(flags,Flag_Sub|Flag_Half_Carry|Flag_Carry);
  return 4;
}

Assistant:

int gb_xor(uint8_t value, Cpu* cpu) {

    uint8_t* a = &(cpu->registers[Register_A]);
    uint8_t* flags = &(cpu->registers[Register_F]);

    *a ^= value;
    *a == 0 ? set_flag(flags, Flag_Zero) : clear_flag(flags, Flag_Zero);

    clear_flag(flags, Flag_Sub | Flag_Half_Carry | Flag_Carry);

    return 4;
}